

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::LessEqual(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  BOOL BVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = TaggedInt::Is(aLeft);
  bVar2 = TaggedInt::Is(aRight);
  if (bVar1) {
    if (bVar2) {
      bVar1 = (int)aLeft <= (int)aRight;
      goto LAB_009a0b96;
    }
    if ((ulong)aRight >> 0x32 == 0) goto LAB_009a0b7d;
    dVar4 = (double)(int)aLeft;
LAB_009a0b66:
    dVar5 = JavascriptNumber::GetValue(aRight);
    bVar1 = dVar5 < dVar4;
  }
  else {
    if (!bVar2) {
      if (aRight < (Var)0x4000000000000 || aLeft < (Var)0x4000000000000) goto LAB_009a0b7d;
      dVar4 = JavascriptNumber::GetValue(aLeft);
      goto LAB_009a0b66;
    }
    if (aLeft < (Var)0x4000000000000) {
LAB_009a0b7d:
      BVar3 = RelationalComparisonHelper(aRight,aLeft,scriptContext,false,true);
      bVar1 = BVar3 == 0;
      goto LAB_009a0b96;
    }
    dVar4 = JavascriptNumber::GetValue(aLeft);
    bVar1 = (double)(int)aRight < dVar4;
  }
  bVar1 = !bVar1;
LAB_009a0b96:
  return (BOOL)bVar1;
}

Assistant:

BOOL JavascriptOperators::LessEqual(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_LessEqual);
        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // Works whether it is TaggedInt31 or TaggedInt32
                return ::Math::PointerCastToIntegralTruncate<int>(aLeft) <= ::Math::PointerCastToIntegralTruncate<int>(aRight);
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }
        else if (TaggedInt::Is(aRight))
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
            {
                return JavascriptNumber::GetValue(aLeft) <= TaggedInt::ToDouble(aRight);
            }
        }
        else
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }

        return !RelationalComparisonHelper(aRight, aLeft, scriptContext, false, true);
        JIT_HELPER_END(Op_LessEqual);
    }